

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O2

ostream * detail::operator<<(ostream *os,print_hex<unsigned_long> *s)

{
  uint uVar1;
  ostream *poVar2;
  
  uVar1 = *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]);
  poVar2 = std::operator<<(os,"0x");
  *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
       uVar1 & 0x4a | *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) & 0xffffffb5;
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const print_hex<T> & s) {
	
	std::ios_base::fmtflags old = os.flags();
	
	os << "0x" << std::hex << s.value;
	
	os.setf(old, std::ios_base::basefield);
	return os;
}